

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

int francis_iter(double *A,int N,double *H)

{
  long lVar1;
  int iVar2;
  int iVar3;
  double *A_00;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  double *pdVar14;
  double *pdVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  
  lVar20 = (long)N;
  A_00 = (double *)malloc(lVar20 * lVar20 * 8);
  for (uVar9 = 0; (uint)(N * N) != uVar9; uVar9 = uVar9 + 1) {
    H[uVar9] = A[uVar9];
  }
  uVar19 = N - 1;
  hessenberg(H,N);
  iVar16 = N + 1;
  lVar1 = lVar20 * 8 + 8;
  iVar8 = 0;
  do {
    do {
      if (((int)uVar19 < 2) || (uVar12 = uVar19, N * 0x1e <= iVar8)) {
        free(A_00);
        return (int)(iVar8 != N * 0x1e);
      }
      while (uVar19 = uVar12, uVar9 = (ulong)uVar19, 1 < (int)uVar19) {
        if ((H[(long)(int)(uVar19 * iVar16) + -1] != 0.0) ||
           (uVar12 = uVar19 - 1, NAN(H[(long)(int)(uVar19 * iVar16) + -1]))) {
          if ((H[(long)(int)((uVar19 - 1) * N + uVar19) + -2] != 0.0) ||
             (NAN(H[(long)(int)((uVar19 - 1) * N + uVar19) + -2]))) goto LAB_0011e45a;
          uVar12 = uVar19 - 2;
        }
      }
    } while (uVar19 != 1);
LAB_0011e45a:
    iVar6 = (uVar19 - 1) * iVar16;
    uVar5 = uVar9;
    uVar13 = uVar9;
    do {
      uVar4 = uVar5;
      iVar2 = (int)uVar13;
      if (uVar4 < 2) {
        uVar5 = 0;
        iVar6 = 1;
        goto LAB_0011e4a0;
      }
      uVar5 = uVar4 - 1;
      lVar10 = (long)iVar6;
      iVar6 = iVar6 + ~N;
      uVar13 = (ulong)(iVar2 - 1);
    } while ((H[lVar10 + -1] != 0.0) || (NAN(H[lVar10 + -1])));
    iVar6 = (int)uVar5 + 1;
LAB_0011e4a0:
    iVar7 = (uVar19 - iVar6) + 2;
    iVar11 = iVar2 + (uint)(iVar2 == 0);
    pdVar14 = (double *)((iVar11 + -1) * lVar1 + (long)H);
    uVar12 = ~(uint)uVar5;
    iVar11 = (iVar11 + uVar12) * iVar7 + (iVar11 - iVar6);
    lVar18 = (long)(int)((int)uVar4 + -1 + (uint)((int)uVar4 == 0));
    for (lVar10 = lVar18; pdVar15 = pdVar14, lVar17 = lVar18, iVar3 = iVar11, lVar10 <= (long)uVar9;
        lVar10 = lVar10 + 1) {
      for (; lVar17 <= (long)uVar9; lVar17 = lVar17 + 1) {
        A_00[iVar3] = *pdVar15;
        pdVar15 = pdVar15 + 1;
        iVar3 = iVar3 + 1;
      }
      pdVar14 = pdVar14 + lVar20;
      iVar11 = iVar11 + iVar7;
    }
    iVar11 = (uVar19 - (uint)uVar5) + 1;
    francisQR(A_00,iVar11);
    iVar7 = iVar2 + (uint)(iVar2 == 0);
    pdVar14 = (double *)((iVar7 + -1) * lVar1 + (long)H);
    iVar6 = (uVar12 + iVar7) * iVar11 + (iVar7 - iVar6);
    for (lVar10 = lVar18; pdVar15 = pdVar14, lVar17 = lVar18, iVar7 = iVar6, lVar10 <= (long)uVar9;
        lVar10 = lVar10 + 1) {
      for (; lVar17 <= (long)uVar9; lVar17 = lVar17 + 1) {
        *pdVar15 = A_00[iVar7];
        pdVar15 = pdVar15 + 1;
        iVar7 = iVar7 + 1;
      }
      pdVar14 = pdVar14 + lVar20;
      iVar6 = iVar6 + iVar11;
    }
    iVar6 = iVar2 + -1 + (uint)(iVar2 == 0);
    pdVar14 = (double *)(((long)iVar6 + 1) * lVar20 * 8 + (long)iVar6 * 8 + (long)H);
    iVar6 = iVar6 * iVar16;
    for (; lVar18 < (long)uVar9; lVar18 = lVar18 + 1) {
      if (ABS(*pdVar14) <= (ABS(pdVar14[1]) + ABS(H[iVar6])) * 1e-12) {
        *pdVar14 = 0.0;
      }
      pdVar14 = pdVar14 + lVar20 + 1;
      iVar6 = iVar6 + iVar16;
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

int francis_iter(double *A, int N, double *H) {
	int success,brkpoint;
	int i,j,it,p,q,t,u;
	double *temp;
	success = 0;
	brkpoint = 30 * N;
	it = 0;
	p = N - 1;
	temp = (double*) malloc(sizeof(double) * N * N);
	for(i = 0; i < N*N;++i) {
		H[i] = A[i];
	}
	
	hessenberg(H,N);
	
	while (p > 1 && it < brkpoint) {
		
		while (p > 1 && (H[N*p + p-1] == 0 || H[N*(p-1) + p-2] == 0)) {
			if (H[N*p + p-1] == 0) {
				p--;
			} else if (H[N*(p-1) + p-2] == 0) {
				p=p-2;
			}
		}
		
		if (p > 0) {
			q = p-1;
			while (q > 0 && fabs(H[N*q + q-1]) != 0) {
				q--;
			}
			//printf("%d %d \n",q,p);
			for (i=q; i <= p; i++) {
				t = i * N;
				u = (i-q) * (p-q+1);
				for (j=q; j <= p; j++) {
					temp[u+j-q] = H[t+j];
				}
			}
			francisQR(temp,p-q+1);
			for (i=q; i <= p; i++) {
				t = i * N;
				u = (i-q) * (p-q+1);
				for (j=q; j <= p; j++) {
					H[t+j] = temp[u+j-q];
				}
			}
			//mdisplay(H,N,N);
			for(i = q; i <= p-1;++i) {
				if ( fabs(H[(i+1)*N+i]) <= TOL * (fabs(H[i*N+i]) + fabs(H[(i+1)*N+i+1]) ) ) {
					H[(i+1)*N+i] = 0.;
				}
			}
			it++;
			//printf("iter %d \n",it);
		}
	}
	
	if (it == brkpoint) {
		success = 0;
	} else {
		success = 1;
	}
	
	free(temp);
	return success;
}